

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QTextFormat>::truncate
          (QGenericArrayOps<QTextFormat> *this,char *__file,__off_t __length)

{
  QTextFormat *pQVar1;
  QTextFormat *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QTextFormat> *this_00;
  
  pQVar1 = QArrayDataPointer<QTextFormat>::begin((QArrayDataPointer<QTextFormat> *)0x855d01);
  this_00 = (QArrayDataPointer<QTextFormat> *)(pQVar1 + (long)__file);
  QArrayDataPointer<QTextFormat>::end(this_00);
  std::destroy<QTextFormat*>((QTextFormat *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QTextFormat>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }